

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

void lj_tab_free(global_State *g,GCtab *t)

{
  undefined4 uVar1;
  long lVar2;
  long in_RSI;
  long in_RDI;
  
  if (*(int *)(in_RSI + 0x1c) != 0) {
    uVar1 = *(undefined4 *)(in_RSI + 0x14);
    lVar2 = (ulong)(*(int *)(in_RSI + 0x1c) + 1) * 0x18;
    *(int *)(in_RDI + 0x50) = *(int *)(in_RDI + 0x50) - (int)lVar2;
    *(long *)(in_RDI + 0x90) = lVar2 + *(long *)(in_RDI + 0x90);
    (**(code **)(in_RDI + 0x40))(*(undefined8 *)(in_RDI + 0x48),uVar1,lVar2,0);
  }
  if ((*(int *)(in_RSI + 0x18) != 0) && (*(char *)(in_RSI + 7) < '\x01')) {
    uVar1 = *(undefined4 *)(in_RSI + 8);
    lVar2 = (ulong)*(uint *)(in_RSI + 0x18) * 8;
    *(int *)(in_RDI + 0x50) = *(int *)(in_RDI + 0x50) - (int)lVar2;
    *(long *)(in_RDI + 0x90) = lVar2 + *(long *)(in_RDI + 0x90);
    (**(code **)(in_RDI + 0x40))(*(undefined8 *)(in_RDI + 0x48),uVar1,lVar2,0);
  }
  if (*(char *)(in_RSI + 7) == '\0') {
    *(int *)(in_RDI + 0x50) = *(int *)(in_RDI + 0x50) + -0x20;
    *(long *)(in_RDI + 0x90) = *(long *)(in_RDI + 0x90) + 0x20;
    (**(code **)(in_RDI + 0x40))(*(undefined8 *)(in_RDI + 0x48),in_RSI,0x20,0);
  }
  else {
    lVar2 = (ulong)((int)*(char *)(in_RSI + 7) & 0x7f) * 8 + 0x20;
    *(int *)(in_RDI + 0x50) = *(int *)(in_RDI + 0x50) - (int)lVar2;
    *(long *)(in_RDI + 0x90) = lVar2 + *(long *)(in_RDI + 0x90);
    (**(code **)(in_RDI + 0x40))(*(undefined8 *)(in_RDI + 0x48),in_RSI,lVar2,0);
  }
  *(long *)(in_RDI + 0xd0) = *(long *)(in_RDI + 0xd0) + -1;
  return;
}

Assistant:

void LJ_FASTCALL lj_tab_free(global_State *g, GCtab *t)
{
  if (t->hmask > 0)
    lj_mem_freevec(g, noderef(t->node), t->hmask+1, Node);
  if (t->asize > 0 && LJ_MAX_COLOSIZE != 0 && t->colo <= 0)
    lj_mem_freevec(g, tvref(t->array), t->asize, TValue);
  if (LJ_MAX_COLOSIZE != 0 && t->colo)
    lj_mem_free(g, t, sizetabcolo((uint32_t)t->colo & 0x7f));
  else
    lj_mem_freet(g, t);
  g->gc.tabnum--;
}